

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugin.cpp
# Opt level: O2

Plugin * csm::Plugin::findPlugin(string *pluginName,WarningList *warnings)

{
  __type _Var1;
  Impl *impl;
  _List_node_base *p_Var2;
  Plugin *pPVar3;
  _List_node_base *p_Var4;
  Locker locker;
  allocator<char> local_c6;
  allocator<char> local_c5;
  WarningType local_c4;
  Locker local_c0;
  string local_b8;
  string local_98;
  Warning local_78;
  
  impl = Plugin::impl();
  Impl::Locker::Locker(&local_c0,impl);
  p_Var2 = (_List_node_base *)getList_abi_cxx11_();
  p_Var4 = p_Var2;
  do {
    p_Var4 = (((_List_base<const_csm::Plugin_*,_std::allocator<const_csm::Plugin_*>_> *)
              &p_Var4->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    if (p_Var4 == p_Var2) {
      if (warnings != (WarningList *)0x0) {
        local_c4 = DATA_NOT_AVAILABLE;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_98,"No matching plugin found",&local_c5);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_b8,"Plugin::findPlugin",&local_c6);
        Warning::Warning(&local_78,&local_c4,&local_98,&local_b8);
        std::__cxx11::list<csm::Warning,_std::allocator<csm::Warning>_>::push_back
                  (warnings,&local_78);
        Warning::~Warning(&local_78);
        std::__cxx11::string::~string((string *)&local_b8);
        std::__cxx11::string::~string((string *)&local_98);
      }
      pPVar3 = (Plugin *)0x0;
      goto LAB_0011f174;
    }
    (**(code **)(*(long *)p_Var4[1]._M_next + 0x10))(&local_78);
    _Var1 = std::operator==(pluginName,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &local_78);
    std::__cxx11::string::~string((string *)&local_78);
  } while (!_Var1);
  pPVar3 = (Plugin *)p_Var4[1]._M_next;
LAB_0011f174:
  Impl::Locker::~Locker(&local_c0);
  return pPVar3;
}

Assistant:

const Plugin* Plugin::findPlugin(const std:: string& pluginName,
                                 WarningList* warnings)
{
   Impl::Locker locker(impl());

   const PluginList& plugins = getList();

   for (PluginList::const_iterator i = plugins.begin();
        i != plugins.end(); ++i)
   {
      if (pluginName == (*i)->getPluginName())
      {
         return *i;
      }
   }

   // plugin not found
   if (warnings)
   {
      warnings->push_back(Warning(Warning::DATA_NOT_AVAILABLE,
                                  "No matching plugin found",
                                  "Plugin::findPlugin"));
   }

   return NULL;
}